

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall StateIf::execute(StateIf *this,EvalState *state)

{
  string *__lhs;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  
  __lhs = &this->cmp;
  bVar1 = std::operator==(__lhs,"=");
  if (bVar1) {
    iVar2 = (*this->exp1->_vptr_Expression[2])(this->exp1,state);
    iVar3 = (*this->exp2->_vptr_Expression[2])(this->exp2,state);
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    if (iVar2 == iVar3) goto LAB_00109549;
  }
  else {
    bVar1 = std::operator==(__lhs,">");
    if (bVar1) {
      iVar2 = (*this->exp1->_vptr_Expression[2])(this->exp1,state);
      iVar3 = (*this->exp2->_vptr_Expression[2])(this->exp2,state);
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      if (iVar3 < iVar2) goto LAB_00109549;
    }
    else {
      bVar1 = std::operator==(__lhs,"<");
      if (!bVar1) {
        return;
      }
      iVar2 = (*this->exp1->_vptr_Expression[2])(this->exp1,state);
      iVar3 = (*this->exp2->_vptr_Expression[2])(this->exp2,state);
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      if (iVar2 < iVar3) {
LAB_00109549:
        iVar2 = this->Goto_lineNumber;
        *(undefined4 *)puVar4 = 1;
        *(int *)((long)puVar4 + 4) = iVar2;
        goto LAB_0010958a;
      }
    }
  }
  *puVar4 = 2;
LAB_0010958a:
  __cxa_throw(puVar4,&ControlClass::typeinfo,0);
}

Assistant:

void StateIf::execute(EvalState &state) {
    if (cmp == "=") {
        if (exp1->eval(state) == exp2->eval(state))
            throw ControlClass(1, Goto_lineNumber);
        else throw ControlClass(2);
    } else if (cmp == ">") {
        if (exp1->eval(state) > exp2->eval(state))
            throw ControlClass(1, Goto_lineNumber);
        else throw ControlClass(2);
    } else if (cmp == "<") {
        if (exp1->eval(state) < exp2->eval(state))
            throw ControlClass(1, Goto_lineNumber);
        else throw ControlClass(2);
    }
}